

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O2

int main(void)

{
  int i;
  int key;
  NODE *root;
  
  root = (NODE *)0x0;
  for (key = 0; key != 10; key = key + 1) {
    insert(&root,key);
  }
  inorder(root);
  putchar(10);
  delete(&root,3);
  inorder(root);
  putchar(10);
  return 0;
}

Assistant:

int main() {
  NODE *root = NULL;
  for (int i = 0; i < 10; i++) {
    insert(&root, i);
  }
  inorder(root);
  printf("\n");

  delete (&root, 3);
  inorder(root);
  printf("\n");

  return 0;
}